

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__gif_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi__gif *g_00;
  stbi__gif *g;
  stbi_uc *u;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  g_00 = (stbi__gif *)stbi__malloc(0x4860);
  memset(g_00,0,0x4860);
  g = (stbi__gif *)stbi__gif_load_next(s,g_00,comp,req_comp);
  if (g == (stbi__gif *)s) {
    g = (stbi__gif *)0x0;
  }
  if (g == (stbi__gif *)0x0) {
    if (g_00->out != (stbi_uc *)0x0) {
      free(g_00->out);
    }
  }
  else {
    *x = g_00->w;
    *y = g_00->h;
    if ((req_comp != 0) && (req_comp != 4)) {
      g = (stbi__gif *)stbi__convert_format((uchar *)g,4,req_comp,g_00->w,g_00->h);
    }
  }
  free(g_00);
  return (stbi_uc *)g;
}

Assistant:

static stbi_uc *stbi__gif_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi_uc *u = 0;
   stbi__gif* g = (stbi__gif*) stbi__malloc(sizeof(stbi__gif));
   memset(g, 0, sizeof(*g));

   u = stbi__gif_load_next(s, g, comp, req_comp);
   if (u == (stbi_uc *) s) u = 0;  // end of animated gif marker
   if (u) {
      *x = g->w;
      *y = g->h;
      if (req_comp && req_comp != 4)
         u = stbi__convert_format(u, 4, req_comp, g->w, g->h);
   }
   else if (g->out)
      STBI_FREE(g->out);
   STBI_FREE(g);
   return u;
}